

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

dgMeshEffect * __thiscall dgMeshEffect::GetNextLayer(dgMeshEffect *this,HaI32 mark)

{
  double dVar1;
  dgMeshEffect *this_00;
  dgEdge *pdVar2;
  long lVar3;
  dgEdge *pdVar4;
  Iterator local_c70;
  dgPolyhedra polyhedra;
  HaI32 faceIndex [256];
  HaI64 faceDataIndex [256];
  
  local_c70.m_tree = (dgTree<dgEdge,_long> *)this;
  local_c70.m_ptr =
       &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this)->super_dgRedBackNode;
  pdVar4 = (dgEdge *)0x0;
  while ((dgTreeNode *)local_c70.m_ptr != (dgTreeNode *)0x0) {
    pdVar4 = (dgEdge *)((long)local_c70.m_ptr + 0x28);
    if ((((dgEdge *)((long)local_c70.m_ptr + 0x28))->m_mark < mark) &&
       (0 < ((dgEdge *)((long)local_c70.m_ptr + 0x28))->m_incidentFace)) goto LAB_00dac3c2;
    dgTree<dgEdge,_long>::Iterator::operator++(&local_c70,0);
  }
  if (pdVar4 == (dgEdge *)0x0) {
    this_00 = (dgMeshEffect *)0x0;
  }
  else {
LAB_00dac3c2:
    dVar1 = this->m_points[pdVar4->m_incidentVertex].super_dgTemplateVector<double>.m_w;
    dgPolyhedra::dgPolyhedra(&polyhedra);
    local_c70.m_ptr = &dgTree<dgEdge,_long>::Minimum(local_c70.m_tree)->super_dgRedBackNode;
    while ((dgTreeNode *)local_c70.m_ptr != (dgTreeNode *)0x0) {
      if (((((dgEdge *)((long)local_c70.m_ptr + 0x28))->m_mark < mark) &&
          (0 < ((dgEdge *)((long)local_c70.m_ptr + 0x28))->m_incidentFace)) &&
         (pdVar4 = (dgEdge *)((long)local_c70.m_ptr + 0x28),
         (int)this->m_points[pdVar4->m_incidentVertex].super_dgTemplateVector<double>.m_w ==
         (int)dVar1)) {
        lVar3 = 0;
        pdVar2 = pdVar4;
        do {
          pdVar2->m_mark = mark;
          faceIndex[lVar3] = pdVar2->m_incidentVertex;
          faceDataIndex[lVar3] = pdVar2->m_userData;
          if (lVar3 == 0xff) {
            __assert_fail("count < hacd::HaI32 (sizeof (faceIndex)/ sizeof(faceIndex[0]))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                          ,0x937,"dgMeshEffect *dgMeshEffect::GetNextLayer(hacd::HaI32)");
          }
          pdVar2 = pdVar2->m_next;
          lVar3 = lVar3 + 1;
        } while (pdVar2 != pdVar4);
        dgPolyhedra::AddFace(&polyhedra,(HaI32)lVar3,faceIndex,faceDataIndex);
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_c70,0);
    }
    dgPolyhedra::EndFace(&polyhedra);
    if (polyhedra.super_dgTree<dgEdge,_long>.m_count == 0) {
      this_00 = (dgMeshEffect *)0x0;
    }
    else {
      this_00 = (dgMeshEffect *)malloc(0x58);
      dgMeshEffect(this_00,&polyhedra,this);
      if ((this_00->super_dgPolyhedra).m_edgeMark < mark) {
        (this_00->super_dgPolyhedra).m_edgeMark = mark;
      }
    }
    dgPolyhedra::~dgPolyhedra(&polyhedra);
  }
  return this_00;
}

Assistant:

dgMeshEffect* dgMeshEffect::GetNextLayer (hacd::HaI32 mark)
{
	Iterator iter(*this);
	dgEdge* edge = NULL;
	for (iter.Begin (); iter; iter ++) {
		edge = &(*iter);
		if ((edge->m_mark < mark) && (edge->m_incidentFace > 0)) {
			break;
		}
	}

	if (!edge) {
		return NULL;
	}

	hacd::HaI32 layer = hacd::HaI32 (m_points[edge->m_incidentVertex].m_w);
	dgPolyhedra polyhedra;

	polyhedra.BeginFace ();
	for (iter.Begin (); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if ((edge->m_mark < mark) && (edge->m_incidentFace > 0)) {
			hacd::HaI32 thislayer = hacd::HaI32 (m_points[edge->m_incidentVertex].m_w);
			if (thislayer == layer) {
				dgEdge* ptr = edge;
				hacd::HaI32 count = 0;
				hacd::HaI32 faceIndex[256];
				hacd::HaI64 faceDataIndex[256];
				do {
					ptr->m_mark = mark;
					faceIndex[count] = ptr->m_incidentVertex;
					faceDataIndex[count] = ptr->m_userData;
					count ++;
					HACD_ASSERT (count < hacd::HaI32 (sizeof (faceIndex)/ sizeof(faceIndex[0])));
					ptr = ptr->m_next;
				} while (ptr != edge);
				polyhedra.AddFace (count, &faceIndex[0], &faceDataIndex[0]);
			}
		}
	}
	polyhedra.EndFace ();

	dgMeshEffect* solid = NULL;
	if (polyhedra.GetCount()) {
		solid = HACD_NEW(dgMeshEffect)(polyhedra, *this);
		solid->SetLRU(mark);
	}
	return solid;
}